

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O2

int write_webm_file_footer(WebmOutputContext *webm_ctx)

{
  long *plVar1;
  Segment *this;
  bool bVar2;
  char *__ptr;
  size_t sStack_30;
  
  plVar1 = (long *)webm_ctx->writer;
  if ((plVar1 == (long *)0x0) || (this = (Segment *)webm_ctx->segment, this == (Segment *)0x0)) {
    __ptr = "webmenc> segment or writer NULL.\n";
    sStack_30 = 0x21;
  }
  else {
    bVar2 = mkvmuxer::Segment::Finalize(this);
    mkvmuxer::Segment::~Segment(this);
    operator_delete(this);
    (**(code **)(*plVar1 + 0x30))(plVar1);
    webm_ctx->writer = (void *)0x0;
    webm_ctx->segment = (void *)0x0;
    if (bVar2) {
      return 0;
    }
    __ptr = "webmenc> Segment::Finalize failed.\n";
    sStack_30 = 0x23;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  return -1;
}

Assistant:

int write_webm_file_footer(struct WebmOutputContext *webm_ctx) {
  if (!webm_ctx->writer || !webm_ctx->segment) {
    fprintf(stderr, "webmenc> segment or writer NULL.\n");
    return -1;
  }
  mkvmuxer::MkvWriter *const writer =
      reinterpret_cast<mkvmuxer::MkvWriter *>(webm_ctx->writer);
  mkvmuxer::Segment *const segment =
      reinterpret_cast<mkvmuxer::Segment *>(webm_ctx->segment);
  const bool ok = segment->Finalize();
  delete segment;
  delete writer;
  webm_ctx->writer = NULL;
  webm_ctx->segment = NULL;

  if (!ok) {
    fprintf(stderr, "webmenc> Segment::Finalize failed.\n");
    return -1;
  }

  return 0;
}